

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

string * __thiscall
re2::DFA::DumpState_abi_cxx11_(string *__return_storage_ptr__,DFA *this,State *state)

{
  int iVar1;
  char *pcVar2;
  char *__s;
  int i;
  long lVar3;
  string local_50;
  
  if (this == (DFA *)0x2) {
    pcVar2 = "*";
  }
  else if (this == (DFA *)0x1) {
    pcVar2 = "X";
  }
  else {
    if (this != (DFA *)0x0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      StringPrintf_abi_cxx11_(&local_50,"(%p)",this);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      lVar3 = 0;
      pcVar2 = "";
      do {
        if ((int)this->kind_ <= lVar3) {
          StringPrintf_abi_cxx11_(&local_50," flag=%#x",(ulong)*(uint *)&this->init_failed_);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          return __return_storage_ptr__;
        }
        iVar1 = *(int *)((long)&this->prog_->pattern_ + lVar3 * 4);
        __s = "||";
        if (iVar1 == -2) {
LAB_001d3e94:
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,__s);
          pcVar2 = "";
        }
        else {
          if (iVar1 == -1) {
            __s = "|";
            goto LAB_001d3e94;
          }
          StringPrintf_abi_cxx11_(&local_50,"%s%d",pcVar2);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          pcVar2 = ",";
        }
        lVar3 = lVar3 + 1;
      } while( true );
    }
    pcVar2 = "_";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,pcVar2,(allocator<char> *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string DFA::DumpState(State* state) {
  if (state == NULL)
    return "_";
  if (state == DeadState)
    return "X";
  if (state == FullMatchState)
    return "*";
  std::string s;
  const char* sep = "";
  s += StringPrintf("(%p)", state);
  for (int i = 0; i < state->ninst_; i++) {
    if (state->inst_[i] == Mark) {
      s += "|";
      sep = "";
    } else if (state->inst_[i] == MatchSep) {
      s += "||";
      sep = "";
    } else {
      s += StringPrintf("%s%d", sep, state->inst_[i]);
      sep = ",";
    }
  }
  s += StringPrintf(" flag=%#x", state->flag_);
  return s;
}